

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void __thiscall argo::unparser::unparse_object(unparser *this,json *j,int indent_level)

{
  type tVar1;
  writer *pwVar2;
  json_object *pjVar3;
  _Base_ptr p_Var4;
  int iVar5;
  allocator local_82;
  allocator local_81;
  int local_80;
  int local_7c;
  string local_78;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  local_80 = indent_level;
  print_indent(this,indent_level);
  pwVar2 = operator<<(this->m_writer,'{');
  std::__cxx11::string::string((string *)&local_78,this->m_space,&local_81);
  pwVar2 = operator<<(pwVar2,&local_78);
  std::__cxx11::string::string((string *)&local_50,this->m_newline,&local_82);
  operator<<(pwVar2,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  pjVar3 = json::get_object_abi_cxx11_(j);
  local_7c = (int)(pjVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  pjVar3 = json::get_object_abi_cxx11_(j);
  p_Var4 = (pjVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(pjVar3->_M_t)._M_impl.super__Rb_tree_header._M_header;
  do {
    if (p_Var4 == local_58) {
      print_indent(this,local_80);
      pwVar2 = this->m_writer;
      std::__cxx11::string::string((string *)&local_78,this->m_space,(allocator *)&local_50);
      pwVar2 = operator<<(pwVar2,&local_78);
      operator<<(pwVar2,'}');
      std::__cxx11::string::~string((string *)&local_78);
      return;
    }
    print_indent(this,this->m_indent_inc + local_80);
    pwVar2 = operator<<(this->m_writer,'\"');
    pwVar2 = operator<<(pwVar2,(string *)(p_Var4 + 1));
    pwVar2 = operator<<(pwVar2,'\"');
    std::__cxx11::string::string((string *)&local_78,this->m_space,&local_81);
    pwVar2 = operator<<(pwVar2,&local_78);
    pwVar2 = operator<<(pwVar2,':');
    std::__cxx11::string::string((string *)&local_50,this->m_space,&local_82);
    operator<<(pwVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_78);
    tVar1 = json::get_instance_type(*(json **)(p_Var4 + 2));
    if (tVar1 == object_e) {
LAB_0011969f:
      pwVar2 = this->m_writer;
      std::__cxx11::string::string((string *)&local_78,this->m_newline,(allocator *)&local_50);
      operator<<(pwVar2,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      iVar5 = this->m_indent_inc * 2;
    }
    else {
      tVar1 = json::get_instance_type(*(json **)(p_Var4 + 2));
      if (tVar1 == array_e) goto LAB_0011969f;
      iVar5 = this->m_indent_inc;
    }
    unparse(this,*(json **)(p_Var4 + 2),iVar5 + local_80);
    if (1 < local_7c) {
      operator<<(this->m_writer,',');
    }
    pwVar2 = this->m_writer;
    std::__cxx11::string::string((string *)&local_78,this->m_newline,(allocator *)&local_50);
    operator<<(pwVar2,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    local_7c = local_7c + -1;
  } while( true );
}

Assistant:

void unparser::unparse_object(const json &j, int indent_level)
{
    print_indent(indent_level);
    m_writer << '{' << m_space << m_newline;
    int n = j.get_object().size();
    for (const auto &p : j.get_object())
    {
        print_indent(indent_level + m_indent_inc);
        m_writer << '"' << p.first << '"' << m_space << ':' << m_space;
        if (p.second->get_instance_type() == json::object_e ||
            p.second->get_instance_type() == json::array_e)
        {
            m_writer << m_newline;
            unparse(*(p.second), indent_level + (m_indent_inc * 2));
        }
        else
        {
            unparse(*(p.second), indent_level + m_indent_inc);
        }
        if (n-- > 1)
        {
            m_writer << ',';
        }
        m_writer << m_newline;
    }
    print_indent(indent_level);
    m_writer << m_space << '}';
}